

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  size_t n;
  size_t len;
  
  puVar3 = *p;
  if (end == puVar3 || (long)end - (long)puVar3 < 0) {
    iVar5 = -0x2460;
  }
  else {
    if (*puVar3 == '\x17') {
      n = 2;
      bVar4 = true;
    }
    else {
      if (*puVar3 != '\x18') {
        return -0x2462;
      }
      n = 4;
      bVar4 = false;
    }
    *p = puVar3 + 1;
    iVar5 = mbedtls_asn1_get_len(p,end,&len);
    if (iVar5 == 0) {
      iVar8 = -0x2400;
      uVar7 = len - (n + 8);
      iVar5 = iVar8;
      if ((n + 8 <= len) && (iVar5 = x509_parse_int(p,n,&tm->year), iVar5 == 0)) {
        if (bVar4) {
          iVar5 = tm->year;
          iVar6 = iVar5 + 100;
          if (0x31 < iVar5) {
            iVar6 = iVar5;
          }
          tm->year = iVar6 + 0x76c;
        }
        iVar5 = x509_parse_int(p,2,&tm->mon);
        if (iVar5 == 0) {
          iVar5 = x509_parse_int(p,2,&tm->day);
          if (iVar5 == 0) {
            iVar5 = x509_parse_int(p,2,&tm->hour);
            if (iVar5 == 0) {
              iVar5 = x509_parse_int(p,2,&tm->min);
              if ((iVar5 == 0) && (iVar5 = iVar8, 1 < uVar7)) {
                iVar5 = x509_parse_int(p,2,&tm->sec);
                if (iVar5 == 0) {
                  if (uVar7 != 2) {
                    if (uVar7 != 3) {
                      return -0x2400;
                    }
                    if (**p != 'Z') {
                      return -0x2400;
                    }
                    *p = *p + 1;
                  }
                  uVar1 = tm->year;
                  iVar5 = iVar8;
                  if ((((uVar1 < 10000) && ((uint)tm->hour < 0x18)) && ((uint)tm->min < 0x3c)) &&
                     (((uint)tm->sec < 0x3c && (uVar2 = tm->mon, uVar2 < 0xd)))) {
                    if ((0x15aaU >> (uVar2 & 0x1f) & 1) == 0) {
                      if ((0xa50U >> (uVar2 & 0x1f) & 1) == 0) {
                        if (uVar2 != 2) {
                          return -0x2400;
                        }
                        if (((uVar1 & 3) == 0) && ((short)((uVar1 & 0xffff) % 100) != 0)) {
                          iVar8 = 0x1d;
                        }
                        else {
                          iVar8 = ((short)((uVar1 & 0xffff) % 400) == 0) + 0x1c;
                        }
                      }
                      else {
                        iVar8 = 0x1e;
                      }
                    }
                    else {
                      iVar8 = 0x1f;
                    }
                    iVar6 = tm->day;
                    iVar5 = 0;
                    if (iVar8 < iVar6) {
                      iVar5 = -0x2400;
                    }
                    if (iVar6 < 1) {
                      iVar5 = -0x2400;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar5 = iVar5 + -0x2400;
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_x509_get_time( unsigned char **p, const unsigned char *end,
                           mbedtls_x509_time *tm )
{
    int ret;
    size_t len, year_len;
    unsigned char tag;

    if( ( end - *p ) < 1 )
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    tag = **p;

    if( tag == MBEDTLS_ASN1_UTC_TIME )
        year_len = 2;
    else if( tag == MBEDTLS_ASN1_GENERALIZED_TIME )
        year_len = 4;
    else
        return( MBEDTLS_ERR_X509_INVALID_DATE +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    (*p)++;
    ret = mbedtls_asn1_get_len( p, end, &len );

    if( ret != 0 )
        return( MBEDTLS_ERR_X509_INVALID_DATE + ret );

    return x509_parse_time( p, len, year_len, tm );
}